

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-pxr-compat-api.cc
# Opt level: O2

void pxr_compat_api_test(void)

{
  UsdStageRefPtr ref;
  allocator local_39;
  string local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  std::__cxx11::string::string((string *)&local_38,"creat.usda",&local_39);
  pxr::UsdStage::CreateNew(&local_38,LoadAll);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__cxx11::string::string((string *)&local_38,"input.usda",&local_39);
  pxr::UsdStage::Open(&local_38,LoadAll);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return;
}

Assistant:

void pxr_compat_api_test(void) {
  {
    auto ref = UsdStage::CreateNew("creat.usda");
  }

  {
    auto ref = UsdStage::Open("input.usda");
  }

}